

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-model.h
# Opt level: O2

void __thiscall
mp::NLFeeder_Easy::
FeedObjExpression<mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,mp::NLFeeder_Easy>>::ExprArgWriter>
          (NLFeeder_Easy *this,int param_1,ExprArgWriter *ew)

{
  double dVar1;
  int iVar2;
  size_t *psVar3;
  int *piVar4;
  double *pdVar5;
  char **ppcVar6;
  char *pcVar7;
  size_t sVar8;
  size_t sVar9;
  long lVar10;
  bool bVar11;
  ExprArgWriter prod2;
  ExprArgWriter sumw;
  ExprArgWriter prod1;
  
  sVar9 = (this->nlme_).Q_.num_nz_;
  dVar1 = (this->nlme_).obj_c0_;
  if (sVar9 != 0) {
    psVar3 = (this->nlme_).Q_.start_;
    piVar4 = (this->nlme_).Q_.index_;
    pdVar5 = (this->nlme_).Q_.value_;
    NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_mp::NLFeeder_Easy>_>::ExprArgWriter::OPutN
              (&sumw,(int)ew,0x36,(char *)(ulong)((int)sVar9 + (uint)(dVar1 != 0.0)));
    if ((dVar1 != 0.0) || (NAN(dVar1))) {
      NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_mp::NLFeeder_Easy>_>::ExprArgWriter::NPut
                (&sumw,dVar1);
    }
    lVar10 = (long)(this->nlme_).vars_.num_col_;
    while (bVar11 = lVar10 != 0, lVar10 = lVar10 + -1, bVar11) {
      for (sVar8 = psVar3[lVar10]; sVar9 != sVar8; sVar8 = sVar8 + 1) {
        dVar1 = pdVar5[sVar8];
        NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_mp::NLFeeder_Easy>_>::ExprArgWriter::
        OPut2(&prod1,(int)&sumw,(char *)0x2);
        NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_mp::NLFeeder_Easy>_>::ExprArgWriter::NPut
                  (&prod1,dVar1 * 0.5);
        NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_mp::NLFeeder_Easy>_>::ExprArgWriter::
        OPut2(&prod2,(int)&prod1,(char *)0x2);
        ppcVar6 = (this->nlme_).var_names_;
        pcVar7 = "";
        if (ppcVar6 != (char **)0x0) {
          pcVar7 = ppcVar6[lVar10];
        }
        NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_mp::NLFeeder_Easy>_>::ExprArgWriter::VPut
                  (&prod2,(this->var_perm_).
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar10].first,pcVar7);
        iVar2 = piVar4[sVar8];
        ppcVar6 = (this->nlme_).var_names_;
        pcVar7 = "";
        if (ppcVar6 != (char **)0x0) {
          pcVar7 = ppcVar6[iVar2];
        }
        NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_mp::NLFeeder_Easy>_>::ExprArgWriter::VPut
                  (&prod2,(this->var_perm_).
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[iVar2].first,pcVar7);
      }
      sVar9 = psVar3[lVar10];
    }
    return;
  }
  NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_mp::NLFeeder_Easy>_>::ExprArgWriter::NPut
            (ew,dVar1);
  return;
}

Assistant:

NLW2_SparseMatrix_C Hessian() const { return Q_; }